

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

Ref cashew::ValueBuilder::makeCall(Ref target,Ref arg)

{
  char *pcVar1;
  Value *pVVar2;
  Ref RVar3;
  Value *this;
  Ref *pRVar4;
  undefined1 *__ptr;
  Ref local_40;
  Ref ret;
  
  ret = arg;
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  pVVar2->type = Null;
  pVVar2 = cashew::Value::setArray(pVVar2,3);
  __ptr = &DAT_00000018;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  (RVar3.inst)->type = Null;
  cashew::Value::free(RVar3.inst,__ptr);
  (RVar3.inst)->type = String;
  pcVar1 = DAT_00da8aa0;
  ((RVar3.inst)->field_1).str.str._M_len = CALL;
  ((RVar3.inst)->field_1).str.str._M_str = pcVar1;
  pVVar2 = cashew::Value::push_back(pVVar2,RVar3);
  pVVar2 = cashew::Value::push_back(pVVar2,target);
  this = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  this->type = Null;
  RVar3.inst = cashew::Value::setArray(this,0);
  local_40.inst = cashew::Value::push_back(pVVar2,RVar3);
  pRVar4 = Ref::operator[](&local_40,2);
  cashew::Value::push_back(pRVar4->inst,ret);
  return (Ref)local_40.inst;
}

Assistant:

static Ref makeCall(Ref target, Ref arg) {
    Ref ret = &makeRawArray(3)
                 ->push_back(makeRawString(CALL))
                 .push_back(target)
                 .push_back(makeRawArray());
    ret[2]->push_back(arg);
    return ret;
  }